

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

RequestBuilder * __thiscall
restincurl::RequestBuilder::BasicAuthentication(RequestBuilder *this,string *name,string *passwd)

{
  CURLoption local_2c;
  pointer local_28;
  
  if (this->is_built_ != true) {
    if ((name->_M_string_length != 0) && (passwd->_M_string_length != 0)) {
      local_2c = CURLOPT_USERNAME;
      local_28 = (name->_M_dataplus)._M_p;
      Options::Set<char_const*>
                ((this->options_)._M_t.
                 super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                 .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,&local_2c,
                 &local_28);
      local_2c = CURLOPT_PASSWORD;
      local_28 = (passwd->_M_dataplus)._M_p;
      Options::Set<char_const*>
                ((this->options_)._M_t.
                 super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                 .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,&local_2c,
                 &local_28);
    }
    return this;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x5f5,
                "RequestBuilder &restincurl::RequestBuilder::BasicAuthentication(const std::string &, const std::string &)"
               );
}

Assistant:

RequestBuilder& BasicAuthentication(const std::string& name,
                                            const std::string& passwd) {
            assert(!is_built_);

            if (!name.empty() && !passwd.empty()) {
                options_->Set(CURLOPT_USERNAME, name.c_str());
                options_->Set(CURLOPT_PASSWORD, passwd.c_str());
            }

            return *this;
        }